

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

Result * __thiscall
httplib::ClientImpl::send_with_content_provider
          (Result *__return_storage_ptr__,ClientImpl *this,string *method,string *path,
          Headers *headers,char *body,size_t content_length,ContentProvider *content_provider,
          ContentProviderWithoutLength *content_provider_without_length,string *content_type)

{
  size_t content_length_00;
  string local_2e8;
  function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> local_2c8;
  undefined1 local_2a8 [8];
  unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> res;
  Error error;
  undefined1 local_290 [8];
  Request req;
  char *body_local;
  Headers *headers_local;
  string *path_local;
  string *method_local;
  ClientImpl *this_local;
  
  req.authorization_count_ = (size_t)body;
  Request::Request((Request *)local_290);
  std::__cxx11::string::operator=((string *)local_290,(string *)method);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&req.path.field_2 + 8),headers);
  std::__cxx11::string::operator=((string *)(req.method.field_2._M_local_buf + 8),(string *)path);
  content_length_00 = req.authorization_count_;
  res._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl._0_4_ = Success;
  std::function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::function
            (&local_2c8,content_provider);
  std::function<bool_(unsigned_long,_httplib::DataSink_&)>::function
            ((function<bool_(unsigned_long,_httplib::DataSink_&)> *)&local_2e8,
             content_provider_without_length);
  send_with_content_provider
            ((ClientImpl *)local_2a8,(Request *)this,local_290,content_length_00,
             (ContentProvider *)content_length,(ContentProviderWithoutLength *)&local_2c8,&local_2e8
             ,(Error *)content_type);
  std::function<bool_(unsigned_long,_httplib::DataSink_&)>::~function
            ((function<bool_(unsigned_long,_httplib::DataSink_&)> *)&local_2e8);
  std::function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::~function(&local_2c8);
  Result::Result(__return_storage_ptr__,
                 (unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)local_2a8
                 ,(Error)res._M_t.
                         super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                         .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl,
                 (Headers *)((long)&req.path.field_2 + 8));
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)local_2a8);
  Request::~Request((Request *)local_290);
  return __return_storage_ptr__;
}

Assistant:

inline Result ClientImpl::send_with_content_provider(
    const std::string &method, const std::string &path, const Headers &headers,
    const char *body, size_t content_length, ContentProvider content_provider,
    ContentProviderWithoutLength content_provider_without_length,
    const std::string &content_type) {
  Request req;
  req.method = method;
  req.headers = headers;
  req.path = path;

  auto error = Error::Success;

  auto res = send_with_content_provider(
      req, body, content_length, std::move(content_provider),
      std::move(content_provider_without_length), content_type, error);

  return Result{std::move(res), error, std::move(req.headers)};
}